

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListGraph.c
# Opt level: O1

void DFSTraverse(LGraph G)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  int in_stack_00000008;
  int visited [100];
  undefined8 auStack_808 [202];
  int local_1b8 [102];
  
  bVar6 = 0;
  uVar4 = (ulong)in_stack_00000008;
  if (0 < (long)uVar4) {
    memset(local_1b8,0,uVar4 * 4);
  }
  printf("DFS: ");
  if (0 < in_stack_00000008) {
    uVar5 = 0;
    do {
      if (local_1b8[uVar5] == 0) {
        puVar2 = (undefined8 *)&stack0x00000008;
        puVar3 = auStack_808;
        for (lVar1 = 0xc9; lVar1 != 0; lVar1 = lVar1 + -1) {
          *puVar3 = *puVar2;
          puVar2 = puVar2 + (ulong)bVar6 * -2 + 1;
          puVar3 = puVar3 + (ulong)bVar6 * -2 + 1;
        }
        DFS(uVar5 & 0xffffffff,local_1b8);
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  putchar(10);
  return;
}

Assistant:

void DFSTraverse(LGraph G)
{
    int i;
    int visited[MAX];       // 顶点访问标记

    // 初始化所有顶点都没有被访问
    for (i = 0; i < G.vexnum; i++)
        visited[i] = 0;

    printf("DFS: ");
    for (i = 0; i < G.vexnum; i++)
    {
        if (!visited[i])
            DFS(G, i, visited);
    }
    printf("\n");
}